

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

Node * __thiscall Patch::splay_node_ending_before<Patch::OldCoordinates>(Patch *this,Point target)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  iterator iVar3;
  Node *pNVar4;
  bool bVar5;
  Node *node;
  size_type __new_size;
  Point node_end;
  Point node_start;
  Point left_ancestor_end;
  Node *local_68;
  vector<Patch::Node*,std::allocator<Patch::Node*>> *local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_38 = target;
  Point::Point(&local_40);
  local_68 = this->root;
  ppNVar2 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar2) {
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2;
  }
  local_60 = (vector<Patch::Node*,std::allocator<Patch::Node*>> *)&this->node_stack;
  __new_size = 0;
  node = (Node *)0x0;
  do {
    if (local_68 == (Node *)0x0) break;
    local_50 = local_68->old_distance_from_left_ancestor;
    local_48 = Point::traverse(&local_40,&local_50);
    local_58 = local_68->old_extent;
    local_50 = Point::traverse(&local_48,&local_58);
    bVar5 = Point::operator<=(&local_50,&local_38);
    pNVar4 = local_68;
    if (bVar5) {
      __new_size = (long)(this->node_stack).
                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->node_stack).
                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
      if (local_68->right == (Node *)0x0) {
        bVar5 = false;
        node = local_68;
      }
      else {
        local_58 = local_68->old_extent;
        local_40 = Point::traverse(&local_48,&local_58);
        iVar3._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>(local_60,iVar3,&local_68);
        }
        else {
          *iVar3._M_current = local_68;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        local_68 = (Node *)&local_68->right;
        node = pNVar4;
LAB_0016ddd5:
        local_68 = local_68->left;
        bVar5 = true;
      }
    }
    else {
      if (local_68->left != (Node *)0x0) {
        iVar3._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>(local_60,iVar3,&local_68);
        }
        else {
          *iVar3._M_current = local_68;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        goto LAB_0016ddd5;
      }
      bVar5 = false;
    }
  } while (bVar5);
  if (node != (Node *)0x0) {
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize
              ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)local_60,__new_size);
    splay_node(this,node);
  }
  return node;
}

Assistant:

Patch::Node *Patch::splay_node_ending_before(Point target) {
  Node *splayed_node = nullptr;
  Point left_ancestor_end = Point();
  Node *node = root;

  node_stack.clear();
  size_t splayed_node_ancestor_count = 0;
  while (node) {
    Point node_start = left_ancestor_end.traverse(
        CoordinateSpace::distance_from_left_ancestor(node));
    Point node_end = node_start.traverse(CoordinateSpace::extent(node));
    if (node_end <= target) {
      splayed_node = node;
      splayed_node_ancestor_count = node_stack.size();
      if (node->right) {
        left_ancestor_end = node_start.traverse(CoordinateSpace::extent(node));
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (splayed_node) {
    node_stack.resize(splayed_node_ancestor_count);
    splay_node(splayed_node);
  }

  return splayed_node;
}